

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O0

bool boost::operator<(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *a,
                     dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_type i;
  size_type ii;
  size_type local_20;
  
  sVar2 = dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
  sVar3 = dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  if (sVar2 != sVar3) {
    __assert_fail("a.size() == b.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                  ,0x573,
                  "bool boost::operator<(const dynamic_bitset<Block, Allocator> &, const dynamic_bitset<Block, Allocator> &) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                 );
  }
  local_20 = dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::num_blocks
                       ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x1d65ef);
  while( true ) {
    if (local_20 == 0) {
      return false;
    }
    sVar2 = local_20 - 1;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->m_bits,sVar2);
    uVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RSI->m_bits,sVar2);
    if (uVar1 < *pvVar4) break;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->m_bits,sVar2);
    uVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RSI->m_bits,sVar2);
    if (*pvVar4 < uVar1) {
      return false;
    }
    local_20 = local_20 - 1;
  }
  return true;
}

Assistant:

bool operator<(const dynamic_bitset<Block, Allocator>& a,
               const dynamic_bitset<Block, Allocator>& b)
{
    assert(a.size() == b.size());
    typedef typename dynamic_bitset<Block, Allocator>::size_type size_type;

    //if (a.size() == 0)
    //  return false;

    // Since we are storing the most significant bit
    // at pos == size() - 1, we need to do the comparisons in reverse.
    //
    for (size_type ii = a.num_blocks(); ii > 0; --ii) {
      size_type i = ii-1;
      if (a.m_bits[i] < b.m_bits[i])
        return true;
      else if (a.m_bits[i] > b.m_bits[i])
        return false;
    }
    return false;
}